

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void handle_D_option(char *z)

{
  int iVar1;
  char **ppcVar2;
  size_t sVar3;
  char *__dest;
  int iVar4;
  char **__s;
  long lVar5;
  
  lVar5 = (long)nDefine;
  nDefine = nDefine + 1;
  ppcVar2 = (char **)realloc(azDefine,lVar5 * 8 + 8);
  if (ppcVar2 == (char **)0x0) {
    __s = azDefine;
    azDefine = ppcVar2;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar2;
    sVar3 = strlen(z);
    __s = (char **)(long)((int)sVar3 + 1);
    __dest = (char *)malloc((size_t)__s);
    ppcVar2[lVar5] = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,z);
      for (; (*__dest != '\0' && (*__dest != '=')); __dest = __dest + 1) {
      }
      *__dest = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar3 = strlen((char *)__s);
  user_templatename = (char *)malloc((long)((int)sVar3 + 1));
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)__s);
    return;
  }
  handle_T_option_cold_1();
  if (0 < made_files_count) {
    lVar5 = 0;
    iVar1 = made_files_count;
    iVar4 = successful_exit;
    do {
      if (iVar4 == 0) {
        remove(made_files[lVar5]);
        iVar1 = made_files_count;
        iVar4 = successful_exit;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar1);
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}